

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

object * objectRead(FILE *fp)

{
  uint uVar1;
  object *poVar2;
  object *poVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint local_34;
  ulong uVar8;
  
  uVar1 = get_byte(fp);
  if (uVar1 == 0xffffffff) {
    error_impl("readTag",0x2c0,"Unexpected EOF reading image file: reading tag byte.");
    local_34 = 0xe0;
    uVar8 = 0xf;
LAB_00106e75:
    uVar7 = (uint)uVar8;
    error_impl("readTag",0x2d2,
               "readTag(): Error reading image file: tag value field exceeds machine word size.  Image created on another machine? Field size=%d"
               ,uVar8);
  }
  else {
    local_34 = uVar1 & 0xe0;
    uVar7 = uVar1 & 0xf;
    uVar8 = (ulong)uVar7;
    if ((uVar1 & 0x10) == 0) goto LAB_00106ee6;
    local_34 = uVar1 & 0xe0;
    if (8 < uVar7) goto LAB_00106e75;
  }
  uVar8 = 0;
  for (iVar6 = 0; uVar7 << 3 != iVar6; iVar6 = iVar6 + 8) {
    uVar1 = get_byte(fp);
    if (uVar1 == 0xffffffff) {
      error_impl("readTag",0x2d9,"readTag(): Unexpected EOF reading image file!");
    }
    uVar8 = (ulong)((uint)uVar8 | (uVar1 & 0xff) << ((byte)iVar6 & 0x1f));
  }
LAB_00106ee6:
  iVar6 = (int)uVar8;
  switch(local_34 >> 5) {
  case 0:
    poVar2 = (object *)0x0;
    error_impl("objectRead",0x26b,"objectRead(): Read in a NULL object!");
    break;
  case 1:
    poVar2 = (object *)((long)&memoryPointer->header + (long)(iVar6 * -8 + -0x10));
    memoryPointer = poVar2;
    if ((long)poVar2 < (long)memoryBase) {
      poVar2 = gcollect(iVar6);
    }
    else {
      poVar2->header = (ulong)(uint)(iVar6 * 4);
    }
    lVar4 = (long)indirtop;
    indirtop = indirtop + 1;
    indirArray[lVar4] = poVar2;
    poVar3 = objectRead(fp);
    poVar2->class = poVar3;
    uVar5 = 0;
    if (iVar6 < 1) {
      uVar8 = 0;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      poVar3 = objectRead(fp);
      (&poVar2[1].header)[uVar5] = (uintptr_t)poVar3;
    }
    break;
  case 3:
    iVar6 = -iVar6;
  case 2:
    poVar2 = (object *)((long)iVar6 * 2 + 1);
    break;
  case 4:
    poVar2 = gcialloc(iVar6);
    lVar4 = (long)indirtop;
    indirtop = indirtop + 1;
    indirArray[lVar4] = poVar2;
    uVar5 = 0;
    if (iVar6 < 1) {
      uVar8 = 0;
    }
    for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      iVar6 = get_byte(fp);
      *(char *)((long)&poVar2[1].header + uVar5) = (char)iVar6;
    }
    poVar3 = objectRead(fp);
    poVar2->class = poVar3;
    break;
  case 5:
    if (indirtop < iVar6) {
      error_impl("objectRead",0x294,"Illegal previous object index %d (max %d)!",uVar8);
    }
    poVar2 = indirArray[iVar6];
    break;
  case 6:
    poVar2 = *indirArray;
    break;
  default:
    poVar2 = (object *)0x0;
    error_impl("objectRead",0x2a0,"Illegal tag type %d!");
  }
  return poVar2;
}

Assistant:

struct object *objectRead(FILE *fp)
{
    int type;
    int size;
    int val;
    int i;
    struct object *newObj=(struct object *)0;
    struct byteObject *bnewObj;

    /* get the tag header for the object, this has a type and value */
    readTag(fp,&type,&val);

    switch(type) {
    case LST_ERROR_TYPE:    /* nil obj */
        error("objectRead(): Read in a NULL object!");

        break;

    case LST_OBJ_TYPE:  /* ordinary object */
        size = val;
        newObj = gcalloc(size);
        indirArray[indirtop++] = newObj;
        newObj->class = objectRead(fp);

        /* get object field values. */
        for (i = 0; i < size; i++) {
            newObj->data[i] = objectRead(fp);
        }

        break;

    case LST_PINT_TYPE: /* positive integer */
        newObj = newInteger(val);
        break;

    case LST_NINT_TYPE: /* negative integer */
        newObj = newInteger(-val);
        break;

    case LST_BARRAY_TYPE:   /* byte arrays */
        size = val;
//        newObj = staticIAllocate(size);
        newObj = gcialloc(size);
        indirArray[indirtop++] = newObj;
        bnewObj = (struct byteObject *) newObj;
        for (i = 0; i < size; i++) {
            /* FIXME check for EOF! */
            bnewObj->bytes[i] = (uint8_t)get_byte(fp);
        }

        bnewObj->class = objectRead(fp);
        break;

    case LST_POBJ_TYPE: /* previous object */
        if(val>indirtop) {
            error("Illegal previous object index %d (max %d)!",val, indirtop);
        }

        newObj = indirArray[val];

        break;

    case LST_NIL_TYPE:  /* object 0 (nil object) */
        newObj = indirArray[0];
        break;

    default:
        error("Illegal tag type %d!",type);
        break;
    }

    return newObj;
}